

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O3

int ks_resize(kstring_t *s,size_t size)

{
  char *in_RAX;
  ulong uVar1;
  size_t __size;
  
  if (s->m < size) {
    uVar1 = size - 1 >> 1 | size - 1;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    __size = (uVar1 >> 0x10 | uVar1) + 1;
    s->m = __size;
    in_RAX = (char *)realloc(s->s,__size);
    if (in_RAX != (char *)0x0) {
      s->s = in_RAX;
    }
  }
  return (int)in_RAX;
}

Assistant:

static inline int ks_resize(kstring_t *s, size_t size)
{
	if (s->m < size) {
		char *tmp;
		s->m = size;
		kroundup32(s->m);
		if ((tmp = (char*)realloc(s->s, s->m)))
			s->s = tmp;
		else
			return -1;
	}
	return 0;
}